

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O0

int_t mc64qd_(int_t *ip,int_t *lenl,int_t *lenh,int_t *w,int_t *wlen,double *a,int_t *nval,
             double *val)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double split [10];
  int local_60;
  int local_5c;
  int_t pos;
  int_t ii;
  double ha;
  int_t s;
  int_t k;
  int_t j;
  int_t i__3;
  int_t i__2;
  int_t i__1;
  double *a_local;
  int_t *wlen_local;
  int_t *w_local;
  int_t *lenh_local;
  int_t *lenl_local;
  int_t *ip_local;
  
  *nval = 0;
  iVar2 = *wlen;
  for (ha._4_4_ = 1; ha._4_4_ <= iVar2; ha._4_4_ = ha._4_4_ + 1) {
    iVar3 = w[(long)ha._4_4_ + -1];
    iVar4 = ip[(long)iVar3 + -1];
    iVar5 = lenh[(long)iVar3 + -1];
    for (local_5c = ip[(long)iVar3 + -1] + lenl[(long)iVar3 + -1]; local_5c <= iVar4 + iVar5 + -1;
        local_5c = local_5c + 1) {
      dVar1 = a[(long)local_5c + -1];
      if (*nval == 0) {
        *nval = 1;
      }
      else {
        for (ha._0_4_ = *nval; 0 < ha._0_4_; ha._0_4_ = ha._0_4_ + -1) {
          if ((split[(long)(ha._0_4_ + -1) + -1] == dVar1) &&
             (!NAN(split[(long)(ha._0_4_ + -1) + -1]) && !NAN(dVar1))) goto LAB_0011f3c5;
          if (dVar1 < split[(long)(ha._0_4_ + -1) + -1]) {
            local_60 = ha._0_4_ + 1;
            goto LAB_0011f355;
          }
        }
        local_60 = 1;
LAB_0011f355:
        for (ha._0_4_ = *nval; local_60 <= ha._0_4_; ha._0_4_ = ha._0_4_ + -1) {
          split[(long)ha._0_4_ + -1] = split[(long)(ha._0_4_ + -1) + -1];
        }
        split[(long)(local_60 + -1) + -1] = dVar1;
        *nval = *nval + 1;
      }
      if (*nval == 10) goto LAB_0011f3e5;
LAB_0011f3c5:
    }
  }
LAB_0011f3e5:
  if (0 < *nval) {
    *val = split[(long)((*nval + 1) / 2 + -1) + -1];
  }
  return 0;
}

Assistant:

int_t mc64qd_(int_t *ip, int_t *lenl, int_t *lenh, 
	int_t *w, int_t *wlen, double *a, int_t *nval, double *
	val)
{
    /* System generated locals */
    int_t i__1, i__2, i__3;

    /* Local variables */
    int_t j, k, s;
    double ha;
    int_t ii, pos;
    double split[10];


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* This routine searches for at most XX different numerical values */
/* in the columns W(1:WLEN). XX>=2. */
/* Each column J is scanned between IP(J)+LENL(J) and IP(J)+LENH(J)-1 */
/* until XX values are found or all columns have been considered. */
/* On output, NVAL is the number of different values that is found */
/* and SPLIT(1:NVAL) contains the values in decreasing order. */
/* If NVAL > 0, the routine returns VAL = SPLIT((NVAL+1)/2). */

/* Scan columns in W(1:WLEN). For each encountered value, if value not */
/* already present in SPLIT(1:NVAL), insert value such that SPLIT */
/* remains sorted by decreasing value. */
/* The sorting is done by straightforward insertion; therefore the use */
/* of this routine should be avoided for large XX (XX < 20). */
    /* Parameter adjustments */
    --a;
    --w;
    --lenh;
    --lenl;
    --ip;

    /* Function Body */
    *nval = 0;
    i__1 = *wlen;
    for (k = 1; k <= i__1; ++k) {
	j = w[k];
	i__2 = ip[j] + lenh[j] - 1;
	for (ii = ip[j] + lenl[j]; ii <= i__2; ++ii) {
	    ha = a[ii];
	    if (*nval == 0) {
		split[0] = ha;
		*nval = 1;
	    } else {
/* Check presence of HA in SPLIT */
		for (s = *nval; s >= 1; --s) {
		    if (split[s - 1] == ha) {
			goto L15;
		    }
		    if (split[s - 1] > ha) {
			pos = s + 1;
			goto L21;
		    }
/* L20: */
		}
		pos = 1;
/* The insertion */
L21:
		i__3 = pos;
		for (s = *nval; s >= i__3; --s) {
		    split[s] = split[s - 1];
/* L22: */
		}
		split[pos - 1] = ha;
		++(*nval);
	    }
/* Exit loop if XX values are found */
	    if (*nval == 10) {
		goto L11;
	    }
L15:
	    ;
	}
/* L10: */
    }
/* Determine VAL */
L11:
    if (*nval > 0) {
	*val = split[(*nval + 1) / 2 - 1];
    }
    return 0;
}